

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O2

bool llvm::ConvertUTF8toWide(StringRef Source,wstring *Result)

{
  bool bVar1;
  UTF8 **in_R9;
  StringRef Source_00;
  char *ResultPtr;
  UTF8 *ErrorPtr;
  
  std::__cxx11::wstring::resize((ulong)Result);
  ResultPtr = (char *)(Result->_M_dataplus)._M_p;
  Source_00.Length = (size_t)&ResultPtr;
  Source_00.Data = (char *)Source.Length;
  bVar1 = ConvertUTF8toWide((llvm *)0x4,(uint)Source.Data,Source_00,(char **)&ErrorPtr,in_R9);
  if (bVar1) {
    std::__cxx11::wstring::resize((ulong)Result);
  }
  else {
    Result->_M_string_length = 0;
    *(Result->_M_dataplus)._M_p = L'\0';
  }
  return bVar1;
}

Assistant:

bool ConvertUTF8toWide(llvm::StringRef Source, std::wstring &Result) {
  return ConvertUTF8toWideInternal(Source, Result);
}